

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_20::ComputeKRMmatricesGlobal
          (ChElementHexaCorot_20 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChMatrix33<double> *R;
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  PointerType pdVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined8 *puVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ChMatrixDynamic<> CKCt;
  ChMatrixDynamic<> CK;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_161;
  double local_160;
  DenseStorage<double,__1,__1,__1,_1> local_158;
  DenseStorage<double,__1,__1,__1,_1> local_138;
  double local_120;
  double local_118;
  double local_110;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_108;
  ChMatrixRef local_c8;
  ChMatrixRef local_98;
  DstEvaluatorType local_68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_50;
  
  lVar13 = (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
  local_160 = Kfactor;
  local_120 = Mfactor;
  local_118 = Rfactor;
  iVar8 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  if (lVar13 == iVar8) {
    lVar13 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_cols.m_value;
    iVar8 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
    if (lVar13 == iVar8) {
      uVar9 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
      uVar10 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
      local_138.m_data = (double *)0x0;
      local_138.m_rows = 0;
      local_138.m_cols = 0;
      lVar14 = (long)(int)uVar9;
      lVar13 = (long)(int)uVar10;
      if (-1 < (int)(uVar10 | uVar9)) {
        if (((uVar9 != 0) && (uVar10 != 0)) &&
           (SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0) < lVar14)
           ) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ostream::_M_insert<bool>;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_138,lVar13 * lVar14,lVar14,lVar13)
        ;
        uVar9 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
        uVar10 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
        local_158.m_data = (double *)0x0;
        local_158.m_rows = 0;
        local_158.m_cols = 0;
        lVar14 = (long)(int)uVar9;
        lVar13 = (long)(int)uVar10;
        if (-1 < (int)(uVar10 | uVar9)) {
          if ((uVar10 != 0 && uVar9 != 0) &&
             (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar13),0) <
              lVar14)) {
            puVar12 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar12 = std::ostream::_M_insert<bool>;
            __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
                    (&local_158,lVar13 * lVar14,lVar14,lVar13);
          local_108.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = (PointerType)0x0;
          local_108.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = 0;
          local_108.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = 0;
          local_108.
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 0;
          local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_data = (double *)0x0;
          local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_rows = 0;
          local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
          m_storage.m_cols = 0;
          Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
          construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                     &local_108,&this->StiffnessMatrix);
          local_98.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .m_stride.m_outer.m_value = 0;
          local_98.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_data = local_138.m_data;
          local_98.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value = local_138.m_rows;
          local_98.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value = local_138.m_cols;
          if (-1 < (local_138.m_rows | local_138.m_cols) || local_138.m_data == (double *)0x0) {
            R = &(this->super_ChElementCorotational).A;
            local_98.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = local_138.m_cols;
            ChMatrixCorotation::ComputeCK(&local_108,R,0x14,&local_98);
            if (local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                m_storage.m_data != (double *)0x0) {
              free((void *)local_108.m_object.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_data[-1]);
            }
            local_108.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data = (PointerType)0x0;
            local_108.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value = 0;
            local_108.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value = 0;
            local_108.
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = 0;
            local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_data = (double *)0x0;
            local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_rows = 0;
            local_108.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_cols = 0;
            Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
            construct<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                      ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                       &local_108,&local_138);
            local_c8.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = 0;
            local_c8.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data = local_158.m_data;
            local_c8.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value = local_158.m_rows;
            local_c8.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value = local_158.m_cols;
            if (-1 < (local_158.m_rows | local_158.m_cols) || local_158.m_data == (double *)0x0) {
              local_c8.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .m_stride.m_outer.m_value = local_158.m_cols;
              ChMatrixCorotation::ComputeKCt(&local_108,R,0x14,&local_c8);
              if (local_108.m_object.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data
                  != (double *)0x0) {
                free((void *)local_108.m_object.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                             m_storage.m_data[-1]);
              }
              peVar5 = (this->Material).
                       super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              p_Var6 = (this->Material).
                       super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                }
              }
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_118;
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_160;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = peVar5->damping_K;
              auVar2 = vfmadd231sd_fma(auVar18,auVar15,auVar2);
              dVar1 = auVar2._0_8_;
              if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                local_160 = auVar2._0_8_;
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                dVar1 = local_160;
              }
              if ((local_158.m_cols | local_158.m_rows) < 0) {
                __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                              ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                              "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
                             );
              }
              local_108.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .m_stride.m_outer.m_value = (long)local_158.m_data;
              local_108.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .m_stride._8_8_ = local_158.m_cols;
              local_108.
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              .
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value = (long)dVar1;
              if (((H->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_rows.m_value != local_158.m_rows) ||
                 ((H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_cols.m_value != local_158.m_cols)) {
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                              "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>]"
                             );
              }
              local_68.
              super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              .m_data = (H->
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                        ).
                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                        .
                        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                        .m_data;
              local_50.m_dst = &local_68;
              local_68.
              super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
              .m_outerStride.m_value =
                   (H->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).m_stride.m_outer.m_value;
              local_50.m_functor = &local_161;
              local_50.m_src = (SrcEvaluatorType *)&local_108;
              local_50.m_dstExpr = H;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run(&local_50);
              if ((local_120 != 0.0) || (NAN(local_120))) {
                local_110 = (this->Volume *
                            (((this->Material).
                              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChContinuumMaterial).density) / 20.0;
                lVar14 = 0;
                lVar13 = 0;
                while( true ) {
                  iVar8 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
                  if (iVar8 <= lVar13) break;
                  peVar5 = (this->Material).
                           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  p_Var6 = (this->Material).
                           super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
                    }
                  }
                  dVar1 = peVar5->damping_M;
                  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    local_160 = dVar1;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
                    dVar1 = local_160;
                  }
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = dVar1;
                  if (((H->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                       .
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_rows.m_value <= lVar13) ||
                     ((H->
                      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                      ).
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                      .
                      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                      .m_cols.m_value <= lVar13)) {
                    __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                                 );
                  }
                  lVar11 = (H->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).m_stride.m_outer.m_value * lVar13;
                  pdVar7 = (H->
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                           ).
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                           .
                           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                           .m_data;
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = local_118;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = local_120;
                  auVar2 = vfmadd213sd_fma(auVar19,auVar16,auVar3);
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = local_110;
                  auVar4._8_8_ = 0;
                  auVar4._0_8_ = *(ulong *)((long)pdVar7 + lVar11 * 8 + lVar14);
                  auVar2 = vfmadd213sd_fma(auVar2,auVar17,auVar4);
                  *(long *)((long)pdVar7 + lVar11 * 8 + lVar14) = auVar2._0_8_;
                  lVar13 = lVar13 + 1;
                  lVar14 = lVar14 + 8;
                }
              }
              if (local_158.m_data != (double *)0x0) {
                free((void *)local_158.m_data[-1]);
              }
              if (local_138.m_data != (double *)0x0) {
                free((void *)local_138.m_data[-1]);
              }
              return;
            }
          }
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
      }
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
  }
  __assert_fail("(H.rows() == GetNdofs()) && (H.cols() == GetNdofs())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaCorot_20.cpp"
                ,0x22c,
                "virtual void chrono::fea::ChElementHexaCorot_20::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementHexaCorot_20::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == GetNdofs()) && (H.cols() == GetNdofs()));

    // warp the local stiffness matrix K in order to obtain global
    // tangent stiffness CKCt:
    ChMatrixDynamic<> CK(GetNdofs(), GetNdofs());
    ChMatrixDynamic<> CKCt(GetNdofs(), GetNdofs());  // the global, corotated, K matrix, for 20 nodes
    ChMatrixCorotation::ComputeCK(StiffnessMatrix, this->A, 20, CK);
    ChMatrixCorotation::ComputeKCt(CK, this->A, 20, CKCt);

    // For K stiffness matrix and R damping matrix:

    double mkfactor = Kfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingK();
    H = mkfactor * CKCt;

    // For M mass matrix:
    if (Mfactor) {
        double lumped_node_mass = (this->Volume * this->Material->Get_density()) / 20.0;
        for (int id = 0; id < GetNdofs(); id++) {
            double amfactor = Mfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingM();
            H(id, id) += amfactor * lumped_node_mass;
        }
    }
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.
}